

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O0

bool __thiscall
Reducer::shrinkByReduction<wasm::DataSegment>(Reducer *this,DataSegment *segment,size_t bonus)

{
  undefined8 uVar1;
  bool bVar2;
  vector<char,_std::allocator<char>_> *this_00;
  size_type sVar3;
  ostream *poVar4;
  unsigned_long *puVar5;
  byte local_99;
  unsigned_long local_88;
  unsigned_long local_80 [3];
  ulong local_68;
  size_t j;
  vector<char,_std::allocator<char>_> save;
  size_t i;
  size_t skip;
  vector<char,_std::allocator<char>_> *data;
  bool justShrank;
  size_t bonus_local;
  DataSegment *segment_local;
  Reducer *this_local;
  
  data._7_1_ = false;
  this_00 = &segment->data;
  i = 1;
  save.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ = 0;
  while( true ) {
    uVar1 = save.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_;
    sVar3 = std::vector<char,_std::allocator<char>_>::size(this_00);
    local_99 = 0;
    if ((ulong)uVar1 < sVar3) {
      bVar2 = std::vector<char,_std::allocator<char>_>::empty(this_00);
      local_99 = bVar2 ^ 0xff;
    }
    if ((local_99 & 1) == 0) break;
    if ((data._7_1_ != false) || (bVar2 = shouldTryToReduce(this,bonus), bVar2)) {
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)&j,this_00);
      local_68 = 0;
      while ((local_68 < i &&
             (bVar2 = std::vector<char,_std::allocator<char>_>::empty(this_00), !bVar2))) {
        std::vector<char,_std::allocator<char>_>::pop_back(this_00);
        local_68 = local_68 + 1;
      }
      data._7_1_ = writeAndTestReduction(this);
      if (!data._7_1_) {
        std::vector<char,_std::allocator<char>_>::operator=
                  (this_00,(vector<char,_std::allocator<char>_> *)&j);
        this_local._7_1_ = 0;
      }
      else {
        poVar4 = std::operator<<((ostream *)&std::cerr,"|      shrank segment from ");
        sVar3 = std::vector<char,_std::allocator<char>_>::size
                          ((vector<char,_std::allocator<char>_> *)&j);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar3);
        poVar4 = std::operator<<(poVar4," => ");
        sVar3 = std::vector<char,_std::allocator<char>_>::size(this_00);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,sVar3);
        poVar4 = std::operator<<(poVar4," (skip: ");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,i);
        std::operator<<(poVar4,")\n");
        noteReduction(this,1);
        local_80[0] = (unsigned_long)this->factor;
        local_88 = i << 1;
        puVar5 = std::min<unsigned_long>(local_80,&local_88);
        i = *puVar5;
      }
      std::vector<char,_std::allocator<char>_>::~vector((vector<char,_std::allocator<char>_> *)&j);
      if (!data._7_1_) goto LAB_0019f2d6;
    }
    save.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ =
         save.super__Vector_base<char,_std::allocator<char>_>._M_impl._16_8_ + 1;
  }
  this_local._7_1_ = 1;
LAB_0019f2d6:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool shrinkByReduction(T* segment, size_t bonus) {
    // try to reduce to first function. first, shrink segment elements.
    // while we are shrinking successfully, keep going exponentially.
    bool justShrank = false;

    auto& data = segment->data;
    // when we succeed, try to shrink by more and more, similar to bisection
    size_t skip = 1;
    for (size_t i = 0; i < data.size() && !data.empty(); i++) {
      if (justShrank || shouldTryToReduce(bonus)) {
        auto save = data;
        for (size_t j = 0; j < skip; j++) {
          if (data.empty()) {
            break;
          } else {
            data.pop_back();
          }
        }
        justShrank = writeAndTestReduction();
        if (justShrank) {
          std::cerr << "|      shrank segment from " << save.size() << " => "
                    << data.size() << " (skip: " << skip << ")\n";
          noteReduction();
          skip = std::min(size_t(factor), 2 * skip);
        } else {
          data = std::move(save);
          return false;
        }
      }
    }

    return true;
  }